

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.h
# Opt level: O2

void __thiscall L15_3::BadMeanArgumentException::msg(BadMeanArgumentException *this)

{
  std::operator<<((ostream *)&std::cout,"Mean argument(");
}

Assistant:

inline void BadMeanArgumentException::msg() const {
        std::cout << "Mean argument(" << _a << ", " << _b << ") invalid.\n";
    }